

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O0

void __thiscall
EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT(EnvironmentNAVXYTHETAMLEVLAT *this)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  EnvironmentNAVXYTHETALAT *pEVar4;
  long lVar5;
  undefined8 *in_RDI;
  int xind;
  int levelind;
  int aind;
  int tind;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_stack_ffffffffffffff70;
  EnvironmentNAVXYTHETALAT *local_58;
  EnvironmentNAVXYTHETALAT *in_stack_ffffffffffffffb0;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  *in_RDI = &PTR_InitializeEnv_001daa38;
  if (in_RDI[0x3d] != 0) {
    lVar1 = in_RDI[0x3d];
    if (lVar1 != 0) {
      lVar2 = *(long *)(lVar1 + -8);
      for (lVar5 = lVar1 + lVar2 * 0x18; lVar1 != lVar5; lVar5 = lVar5 + -0x18) {
        std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector
                  ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_ffffffffffffff70);
      }
      operator_delete__((void *)(lVar1 + -8),lVar2 * 0x18 + 8);
    }
    in_RDI[0x3d] = 0;
  }
  if (in_RDI[0x3e] != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 6); local_c = local_c + 1) {
      for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x1f); local_10 = local_10 + 1) {
        in_stack_ffffffffffffffb0 =
             *(EnvironmentNAVXYTHETALAT **)
              (*(long *)(in_RDI[0x3e] + (long)local_c * 8) + (long)local_10 * 0x10 + 8);
        if (in_stack_ffffffffffffffb0 != (EnvironmentNAVXYTHETALAT *)0x0) {
          pEVar4 = in_stack_ffffffffffffffb0 + -1;
          lVar1 = *(long *)&in_stack_ffffffffffffffb0[-1].field_0x1d8;
          local_58 = (EnvironmentNAVXYTHETALAT *)
                     (&(in_stack_ffffffffffffffb0->super_EnvironmentNAVXYTHETALATTICE).
                       super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation + lVar1 * 3);
          if (in_stack_ffffffffffffffb0 != local_58) {
            do {
              local_58 = (EnvironmentNAVXYTHETALAT *)&local_58[-1].field_0x1c8;
              std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~vector
                        (in_stack_ffffffffffffff70);
            } while (local_58 != in_stack_ffffffffffffffb0);
          }
          operator_delete__(&pEVar4->field_0x1d8,lVar1 * 0x18 + 8);
        }
      }
      pvVar3 = *(void **)(in_RDI[0x3e] + (long)local_c * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
    }
    if ((void *)in_RDI[0x3e] != (void *)0x0) {
      operator_delete__((void *)in_RDI[0x3e]);
    }
    in_RDI[0x3e] = 0;
  }
  if (in_RDI[0x3f] != 0) {
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x3c); local_14 = local_14 + 1) {
      for (local_18 = 0; local_18 < *(int *)(in_RDI + 5); local_18 = local_18 + 1) {
        pvVar3 = *(void **)(*(long *)(in_RDI[0x3f] + (long)local_14 * 8) + (long)local_18 * 8);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
      }
      pvVar3 = *(void **)(in_RDI[0x3f] + (long)local_14 * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
    }
    if ((void *)in_RDI[0x3f] != (void *)0x0) {
      operator_delete__((void *)in_RDI[0x3f]);
    }
    in_RDI[0x3f] = 0;
  }
  if (in_RDI[0x41] != 0) {
    if ((void *)in_RDI[0x41] != (void *)0x0) {
      operator_delete__((void *)in_RDI[0x41]);
    }
    in_RDI[0x41] = 0;
  }
  if (in_RDI[0x40] != 0) {
    if ((void *)in_RDI[0x40] != (void *)0x0) {
      operator_delete__((void *)in_RDI[0x40]);
    }
    in_RDI[0x40] = 0;
  }
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT()
{
    if (AddLevelFootprintPolygonV != NULL) {
        delete[] AddLevelFootprintPolygonV;
        AddLevelFootprintPolygonV = NULL;
    }

    if (AdditionalInfoinActionsV != NULL) {
        for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
            for (int aind = 0; aind < EnvNAVXYTHETALATCfg.actionwidth; aind++) {
                delete[] AdditionalInfoinActionsV[tind][aind].intersectingcellsV;
            }
            delete[] AdditionalInfoinActionsV[tind];
        }
        delete[] AdditionalInfoinActionsV;
        AdditionalInfoinActionsV = NULL;
    }

    if (AddLevelGrid2D != NULL) {
        for (int levelind = 0; levelind < numofadditionalzlevs; levelind++) {
            for (int xind = 0; xind < EnvNAVXYTHETALATCfg.EnvWidth_c; xind++) {
                delete[] AddLevelGrid2D[levelind][xind];
            }
            delete[] AddLevelGrid2D[levelind];
        }
        delete[] AddLevelGrid2D;
        AddLevelGrid2D = NULL;
    }

    if (AddLevel_cost_possibly_circumscribed_thresh != NULL) {
        delete[] AddLevel_cost_possibly_circumscribed_thresh;
        AddLevel_cost_possibly_circumscribed_thresh = NULL;
    }

    if (AddLevel_cost_inscribed_thresh != NULL) {
        delete[] AddLevel_cost_inscribed_thresh;
        AddLevel_cost_inscribed_thresh = NULL;
    }

    //reset the number of additional levels
    numofadditionalzlevs = 0;
}